

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O2

Parser * __thiscall
clara::detail::Parser::operator|(Parser *__return_storage_ptr__,Parser *this,Opt *other)

{
  Parser local_70;
  
  Parser(&local_70,this);
  std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>::push_back
            (&local_70.m_options,other);
  Parser(__return_storage_ptr__,&local_70);
  ~Parser(&local_70);
  return __return_storage_ptr__;
}

Assistant:

auto operator|( T const &other ) const -> Parser {
            return Parser( *this ) |= other;
        }